

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

void __thiscall ipx::Iterate::Postprocess(Iterate *this)

{
  value_type vVar1;
  bool bVar2;
  Int IVar3;
  Int IVar4;
  int iVar5;
  State SVar6;
  undefined4 extraout_var;
  Vector *this_00;
  Vector *this_01;
  double *pdVar7;
  reference pvVar8;
  void *extraout_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  double dVar9;
  double dVar10;
  SparseMatrix *pSVar11;
  double z_1;
  Int j_1;
  double z;
  Int j;
  SparseMatrix *AI;
  Vector *ub;
  Vector *lb;
  Vector *c;
  Int n;
  Int m;
  undefined4 in_stack_fffffffffffffef8;
  Int in_stack_fffffffffffffefc;
  Iterate *in_stack_ffffffffffffff00;
  Vector *in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  SparseMatrix *in_stack_ffffffffffffff30;
  int local_44;
  int local_34;
  
  IVar3 = Model::rows((Model *)*in_RDI);
  IVar4 = Model::cols((Model *)*in_RDI);
  iVar5 = Model::c((Model *)*in_RDI,in_RSI,extraout_RDX);
  this_00 = Model::lb((Model *)*in_RDI);
  this_01 = Model::ub((Model *)*in_RDI);
  Model::AI((Model *)*in_RDI);
  for (local_34 = 0; local_34 < IVar4 + IVar3; local_34 = local_34 + 1) {
    SVar6 = StateOf((Iterate *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
    if (SVar6 == fixed) {
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_34);
      dVar10 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](this_00,(long)local_34);
      dVar9 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_34);
      *pdVar7 = dVar10 - dVar9;
      pdVar7 = std::valarray<double>::operator[](this_01,(long)local_34);
      dVar10 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_34);
      dVar9 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_34);
      *pdVar7 = dVar10 - dVar9;
      pdVar7 = std::valarray<double>::operator[](this_00,(long)local_34);
      dVar10 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](this_01,(long)local_34);
      if ((dVar10 == *pdVar7) && (!NAN(dVar10) && !NAN(*pdVar7))) {
        pdVar7 = std::valarray<double>::operator[]
                           ((valarray<double> *)CONCAT44(extraout_var,iVar5),(long)local_34);
        dVar10 = *pdVar7;
        dVar9 = DotColumn(in_stack_ffffffffffffff30,(Int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                          in_stack_ffffffffffffff20);
        dVar10 = dVar10 - dVar9;
        if (dVar10 < 0.0) {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0xb),(long)local_34);
          *pdVar7 = -dVar10;
        }
        else {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 9),(long)local_34);
          *pdVar7 = dVar10;
        }
      }
    }
  }
  for (local_44 = 0; local_44 < IVar4 + IVar3; local_44 = local_44 + 1) {
    bVar2 = is_implied(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    if (bVar2) {
      pdVar7 = std::valarray<double>::operator[]
                         ((valarray<double> *)CONCAT44(extraout_var,iVar5),(long)local_44);
      dVar10 = *pdVar7;
      dVar9 = DotColumn(in_stack_ffffffffffffff30,(Int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                        in_stack_ffffffffffffff20);
      pSVar11 = (SparseMatrix *)(dVar10 - dVar9);
      pvVar8 = std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::
               operator[]((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                           *)(in_RDI + 0xd),(long)local_44);
      vVar1 = *pvVar8;
      if (vVar1 == IMPLIED_LB) {
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_44);
        *pdVar7 = (double)pSVar11;
        pdVar7 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_44);
        *pdVar7 = 0.0;
        pdVar7 = std::valarray<double>::operator[](this_00,(long)local_44);
        dVar10 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_44);
        *pdVar7 = dVar10;
        in_stack_ffffffffffffff30 = pSVar11;
      }
      else if (vVar1 == IMPLIED_UB) {
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_44);
        *pdVar7 = 0.0;
        in_stack_ffffffffffffff20 = (Vector *)-(double)pSVar11;
        pdVar7 = std::valarray<double>::operator[]
                           ((valarray<double> *)(in_RDI + 0xb),(long)local_44);
        *pdVar7 = (double)in_stack_ffffffffffffff20;
        pdVar7 = std::valarray<double>::operator[](this_01,(long)local_44);
        in_stack_ffffffffffffff28 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_44);
        *pdVar7 = in_stack_ffffffffffffff28;
      }
      else if (vVar1 == IMPLIED_EQ) {
        if ((double)pSVar11 < 0.0) {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 9),(long)local_44);
          *pdVar7 = 0.0;
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0xb),(long)local_44);
          *pdVar7 = -(double)pSVar11;
        }
        else {
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 9),(long)local_44);
          *pdVar7 = (double)pSVar11;
          pdVar7 = std::valarray<double>::operator[]
                             ((valarray<double> *)(in_RDI + 0xb),(long)local_44);
          *pdVar7 = 0.0;
        }
        pdVar7 = std::valarray<double>::operator[](this_00,(long)local_44);
        dVar10 = *pdVar7;
        pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_44);
        *pdVar7 = dVar10;
      }
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_44);
      in_stack_ffffffffffffff00 = (Iterate *)*pdVar7;
      pdVar7 = std::valarray<double>::operator[](this_00,(long)local_44);
      dVar10 = (double)in_stack_ffffffffffffff00 - *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_44);
      *pdVar7 = dVar10;
      pdVar7 = std::valarray<double>::operator[](this_01,(long)local_44);
      dVar10 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 1),(long)local_44);
      dVar9 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_44);
      *pdVar7 = dVar10 - dVar9;
    }
  }
  *(undefined1 *)((long)in_RDI + 0x109) = 1;
  *(undefined1 *)(in_RDI + 0x21) = 0;
  return;
}

Assistant:

void Iterate::Postprocess() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& c = model_.c();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    // For fixed variables compute xl[j] and xu[j] from x[j]. If the lower and
    // upper bound are equal, set zl[j] or zu[j] such that the variable is dual
    // feasible. Otherwise leave them zero.
    for (Int j = 0; j < n+m; j++) {
        if (StateOf(j) == State::fixed) {
            xl_[j] = x_[j] - lb[j];
            xu_[j] = ub[j] - x_[j];
            assert(zl_[j] == 0.0);
            assert(zu_[j] == 0.0);
            if (lb[j] == ub[j]) {
                double z = c[j] - DotColumn(AI, j, y_);
                if (z >= 0.0)
                    zl_[j] = z;
                else
                    zu_[j] = -z;
            }
        }
    }
    // For implied variables set x[j] to the bound at which it was implied and
    // compute zl[j] or zu[j]. If the variable was implied at both bounds,
    // choose between zl and zu depending on sign.
    for (Int j = 0; j < n+m; j++) {
        if (is_implied(j)) {
            double z = c[j] - DotColumn(AI, j, y_);
            switch (variable_state_[j]) {
            case StateDetail::IMPLIED_EQ:
                assert(lb[j] == ub[j]);
                if (z >= 0.0) {
                    zl_[j] = z;
                    zu_[j] = 0.0;
                } else {
                    zl_[j] = 0.0;
                    zu_[j] = -z;
                }
                x_[j] = lb[j];
                break;
            case StateDetail::IMPLIED_LB:
                zl_[j] = z;
                zu_[j] = 0.0;
                x_[j] = lb[j];
                break;
            case StateDetail::IMPLIED_UB:
                zl_[j] = 0.0;
                zu_[j] = -z;
                x_[j] = ub[j];
                break;
            default:
                assert(0);
            }
            xl_[j] = x_[j] - lb[j];
            xu_[j] = ub[j] - x_[j];
        }
    }
    postprocessed_ = true;
    evaluated_ = false;
}